

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_move_to_word_previous(nk_text_edit *state)

{
  int iVar1;
  nk_text_edit *in_RDI;
  bool bVar2;
  int c;
  int idx;
  
  idx = in_RDI->cursor;
  do {
    idx = idx + -1;
    bVar2 = false;
    if (-1 < idx) {
      iVar1 = nk_is_word_boundary(in_RDI,idx);
      bVar2 = iVar1 == 0;
    }
  } while (bVar2);
  if (idx < 0) {
    idx = 0;
  }
  return idx;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_previous(struct nk_text_edit *state)
{
int c = state->cursor - 1;
while( c >= 0 && !nk_is_word_boundary(state, c))
--c;

if( c < 0 )
c = 0;

return c;
}